

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O0

bool __thiscall
Funcdata::ancestorOpUse(Funcdata *this,int4 maxlevel,Varnode *invn,PcodeOp *op,ParamTrial *trial)

{
  bool bVar1;
  OpCode OVar2;
  int4 iVar3;
  spacetype sVar4;
  PcodeOp *pPVar5;
  AddrSpace *this_00;
  Varnode *pVVar6;
  uintb uVar7;
  PcodeOp *remop;
  Varnode *vn;
  PcodeOp *def;
  int4 i;
  ParamTrial *trial_local;
  PcodeOp *op_local;
  Varnode *invn_local;
  int4 maxlevel_local;
  Funcdata *this_local;
  
  if (maxlevel == 0) {
    return false;
  }
  bVar1 = Varnode::isWritten(invn);
  if (bVar1) {
    pPVar5 = Varnode::getDef(invn);
    OVar2 = PcodeOp::code(pPVar5);
    switch(OVar2) {
    case CPUI_COPY:
      this_00 = Varnode::getSpace(invn);
      sVar4 = AddrSpace::getType(this_00);
      if ((sVar4 == IPTR_INTERNAL) || (bVar1 = Varnode::isAddrForce(invn), bVar1)) {
        pVVar6 = PcodeOp::getIn(pPVar5,0);
        bVar1 = ancestorOpUse(this,maxlevel + -1,pVVar6,op,trial);
        if (!bVar1) {
          return false;
        }
        return true;
      }
      break;
    default:
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      return false;
    case CPUI_INDIRECT:
      bVar1 = PcodeOp::isIndirectCreation(pPVar5);
      if (bVar1) {
        return false;
      }
    case CPUI_MULTIEQUAL:
      def._4_4_ = 0;
      while( true ) {
        iVar3 = PcodeOp::numInput(pPVar5);
        if (iVar3 <= def._4_4_) {
          return false;
        }
        pVVar6 = PcodeOp::getIn(pPVar5,def._4_4_);
        bVar1 = ancestorOpUse(this,maxlevel + -1,pVVar6,op,trial);
        if (bVar1) break;
        def._4_4_ = def._4_4_ + 1;
      }
      return true;
    case CPUI_PIECE:
      pVVar6 = PcodeOp::getIn(pPVar5,1);
      bVar1 = ancestorOpUse(this,maxlevel + -1,pVVar6,op,trial);
      return bVar1;
    case CPUI_SUBPIECE:
      pVVar6 = PcodeOp::getIn(pPVar5,1);
      uVar7 = Varnode::getOffset(pVVar6);
      if (uVar7 == 0) {
        pVVar6 = PcodeOp::getIn(pPVar5,0);
        bVar1 = Varnode::isWritten(pVVar6);
        if (bVar1) {
          pPVar5 = Varnode::getDef(pVVar6);
          OVar2 = PcodeOp::code(pPVar5);
          if ((OVar2 == CPUI_INT_REM) || (OVar2 = PcodeOp::code(pPVar5), OVar2 == CPUI_INT_SREM)) {
            ParamTrial::setRemFormed(trial);
          }
        }
      }
    }
    bVar1 = onlyOpUse(this,invn,op,trial);
    return bVar1;
  }
  bVar1 = Varnode::isInput(invn);
  if (!bVar1) {
    return false;
  }
  bVar1 = Varnode::isTypeLock(invn);
  if (!bVar1) {
    return false;
  }
  bVar1 = onlyOpUse(this,invn,op,trial);
  return bVar1;
}

Assistant:

bool Funcdata::ancestorOpUse(int4 maxlevel,const Varnode *invn,
			     const PcodeOp *op,ParamTrial &trial) const

{
  int4 i;

  if (maxlevel==0) return false;

  if (!invn->isWritten()) {
    if (!invn->isInput()) return false;
    if (!invn->isTypeLock()) return false;
				// If the input is typelocked
				// this is as good as being written
    return onlyOpUse(invn,op,trial); // Test if varnode is only used in op
  }
  
  const PcodeOp *def = invn->getDef();
  switch(def->code()) {
  case CPUI_INDIRECT:
    // An indirectCreation is an indication of an output trial, this should not count as
    // as an "only use"
    if (def->isIndirectCreation())
      return false;
    // fallthru
  case CPUI_MULTIEQUAL:
				// Check if there is any ancestor whose only
				// use is in this op
    for(i=0;i<def->numInput();++i)
      if (ancestorOpUse(maxlevel-1,def->getIn(i),op,trial)) return true;

    return false;
  case CPUI_COPY:
    if ((invn->getSpace()->getType()==IPTR_INTERNAL)||(invn->isAddrForce())) {
				// Bit of a kludge to take into account
				// uniq <- LOAD             uniq=stackX
				//                  <->
				// call(  uniq )            call( uniq )
				// 
				// We follow copys into uniques
      if (!ancestorOpUse(maxlevel-1,def->getIn(0),op,trial)) return false;
      return true;
    }
    break;
  case CPUI_PIECE:
    // Concatenation tends to be artificial, so recurse through the least significant part
    return ancestorOpUse(maxlevel-1,def->getIn(1),op,trial);
  case CPUI_SUBPIECE:
    // This is a rather kludgy way to get around where a DIV (or other similar) instruction
    // causes a register that looks like the high precision piece of the function return
    // to be set with the remainder as a side effect
    if (def->getIn(1)->getOffset()==0) {
      const Varnode *vn = def->getIn(0);
      if (vn->isWritten()) {
	const PcodeOp *remop = vn->getDef();
	if ((remop->code()==CPUI_INT_REM)||(remop->code()==CPUI_INT_SREM))
	  trial.setRemFormed();
      }
    }
    break;
  case CPUI_CALL:
  case CPUI_CALLIND:
    return false;		// A call is never a good indication of a single op use
  default:
    break;
  }
				// This varnode must be top ancestor at this point
  return onlyOpUse(invn,op,trial); // Test if varnode is only used in op
}